

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::loadParameters(IMLE<1,_1,_FastLinearExpert> *this,string *fname)

{
  char cVar1;
  long lVar2;
  Scal *pSVar3;
  Scal *pSVar4;
  byte bVar5;
  xml_iarchive ia;
  Param newParams;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  xml_iarchive local_350;
  Param local_2c0;
  istream local_228 [520];
  
  bVar5 = 0;
  Param::Param(&local_2c0);
  std::ifstream::ifstream(local_228,(fname->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_370,"IMLE: Could not open file ",fname);
    local_350._0_8_ = &local_350.field_0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_350,local_370._M_dataplus._M_p,
               local_370._M_dataplus._M_p + (long)((X *)(local_370._M_string_length + 0x10) + -2));
    std::__cxx11::string::append((char *)&local_350);
    message(this,(string *)&local_350);
    if ((undefined1 *)local_350._0_8_ != &local_350.field_0x10) {
      operator_delete((void *)local_350._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
  }
  else {
    boost::archive::xml_iarchive::xml_iarchive(&local_350,local_228,0);
    local_370._M_dataplus._M_p = "newParams";
    local_370._M_string_length = (size_type)&local_2c0;
    boost::archive::basic_xml_iarchive<boost::archive::xml_iarchive>::
    load_override<IMLE<1,1,FastLinearExpert>::Param>
              ((basic_xml_iarchive<boost::archive::xml_iarchive> *)&local_350,
               (nvp<IMLE<1,_1,_FastLinearExpert>::Param> *)&local_370);
    std::ifstream::close();
    (this->param).accelerated = local_2c0.accelerated;
    *(undefined7 *)&(this->param).field_0x1 = local_2c0._1_7_;
    (this->param).alpha = local_2c0.alpha;
    (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
    .array[0] = (double)local_2c0.Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                        m_storage.m_data.array[0];
    pSVar3 = &local_2c0.sigma0;
    pSVar4 = &(this->param).sigma0;
    for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pSVar4 = *pSVar3;
      pSVar3 = pSVar3 + (ulong)bVar5 * -2 + 1;
      pSVar4 = pSVar4 + (ulong)bVar5 * -2 + 1;
    }
    (this->param).saveOnExit = local_2c0.saveOnExit;
    (this->param).iterMax = local_2c0.iterMax;
    std::__cxx11::string::_M_assign((string *)&(this->param).defaultSave);
    set_internal_parameters(this);
    boost::archive::xml_iarchive_impl<boost::archive::xml_iarchive>::~xml_iarchive_impl
              (&local_350.super_xml_iarchive_impl<boost::archive::xml_iarchive>);
  }
  std::ifstream::~ifstream(local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.defaultSave._M_dataplus._M_p != &local_2c0.defaultSave.field_2) {
    operator_delete(local_2c0.defaultSave._M_dataplus._M_p);
  }
  return (bool)cVar1;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::loadParameters(std::string const &fname)
{
#ifdef IMLE_NO_TEMPLATES
    Param newParams(d,D);
#else
    Param newParams;
#endif

    std::ifstream ifs(fname.c_str());
    	if( !ifs.is_open() )
	{
		message(OPENERR + fname + "!!");
		return false;
	}

    assert(ifs.good());
    boost::archive::xml_iarchive ia(ifs);
    ia & BOOST_SERIALIZATION_NVP(newParams);
    ifs.close();

    setParameters(newParams);

	return true;
}